

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamEntry::ParamEntry
          (ParamEntry *this,type_metatype t,int4 grp,int4 grpsize,Address *loc,int4 sz,int4 mnsz,
          int4 align,bool normalstack)

{
  AddrSpace *pAVar1;
  uintb uVar2;
  bool normalstack_local;
  int4 sz_local;
  Address *loc_local;
  int4 grpsize_local;
  int4 grp_local;
  type_metatype t_local;
  ParamEntry *this_local;
  
  this->flags = 0;
  this->type = t;
  this->group = grp;
  this->groupsize = grpsize;
  pAVar1 = Address::getSpace(loc);
  this->spaceid = pAVar1;
  uVar2 = Address::getOffset(loc);
  this->addressbase = uVar2;
  this->size = sz;
  this->minsize = mnsz;
  this->alignment = align;
  if (this->alignment == 0) {
    this->numslots = 1;
  }
  else {
    this->numslots = this->size / this->alignment;
  }
  if (!normalstack) {
    this->flags = this->flags | 2;
  }
  resolveJoin(this);
  return;
}

Assistant:

ParamEntry::ParamEntry(type_metatype t,int4 grp,int4 grpsize,const Address &loc,int4 sz,int4 mnsz,int4 align,bool normalstack)

{
  flags = 0;
  type = t;
  group = grp;
  groupsize = grpsize;
  spaceid = loc.getSpace();
  addressbase = loc.getOffset();
  size = sz;
  minsize = mnsz;
  alignment = align;
  if (alignment != 0)
    numslots = size / alignment;
  else
    numslots = 1;
  if (!normalstack)
    flags |= reverse_stack;
  resolveJoin();
}